

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall mp::StringFileWriter::Write<char_const*>(StringFileWriter *this,char *s)

{
  size_t sVar1;
  
  if (this->fTriedOpen_ == false) {
    Open(this);
  }
  this->cnt_ = this->cnt_ + 1;
  File::Printf(&this->nm,"%s\n",s);
  sVar1 = strlen(s);
  if (*this->len_max_ < (int)sVar1) {
    *this->len_max_ = (int)sVar1;
  }
  return;
}

Assistant:

void Write(Value s) {
    if (!fTriedOpen_)
      Open();
    ++cnt_;
    auto l = Print_ReturnLen1(s);
    if (l>len_max_)
      len_max_ = l;
  }